

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

ScriptPtr * __thiscall FBehavior::FindScript(FBehavior *this,int script)

{
  int iVar1;
  uint uVar2;
  ScriptPtr *pSVar3;
  int iVar4;
  int iVar5;
  
  if (0 < this->NumScripts) {
    iVar4 = this->NumScripts + -1;
    iVar5 = 0;
    do {
      uVar2 = (uint)(iVar5 + iVar4) >> 1;
      iVar1 = this->Scripts[uVar2].Number;
      if (iVar1 == script) {
        pSVar3 = this->Scripts + uVar2;
        if ((uint)(iVar5 + iVar4) < 2) {
          return pSVar3;
        }
        if (pSVar3[-1].Number == script) {
          pSVar3 = pSVar3 + -1;
        }
        return pSVar3;
      }
      if (iVar1 < script) {
        iVar5 = uVar2 + 1;
      }
      else {
        iVar4 = uVar2 - 1;
      }
    } while (iVar5 <= iVar4);
  }
  return (ScriptPtr *)0x0;
}

Assistant:

const ScriptPtr *FBehavior::FindScript (int script) const
{
	const ScriptPtr *ptr = BinarySearch<ScriptPtr, int>
		((ScriptPtr *)Scripts, NumScripts, &ScriptPtr::Number, script);

	// If the preceding script has the same number, return it instead.
	// See the note by the script sorting above for why.
	if (ptr > Scripts)
	{
		if (ptr[-1].Number == script)
		{
			ptr--;
		}
	}
	return ptr;
}